

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDfs.c
# Opt level: O3

Vec_Vec_t * Ivy_ManLevelize(Ivy_Man_t *p)

{
  void *pvVar1;
  uint *puVar2;
  Vec_Vec_t *pVVar3;
  void **ppvVar4;
  void *pvVar5;
  Vec_Ptr_t *pVVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  uint local_4c;
  
  pVVar3 = (Vec_Vec_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  pVVar3->pArray = ppvVar4;
  pVVar6 = p->vObjs;
  if (0 < pVVar6->nSize) {
    local_4c = 100;
    lVar13 = 0;
    lVar9 = 0;
    do {
      pvVar1 = pVVar6->pArray[lVar13];
      lVar10 = lVar9;
      if (pvVar1 != (void *)0x0) {
        uVar7 = *(uint *)((long)pvVar1 + 8) & 0xf;
        if (uVar7 == 7) {
          __assert_fail("!Ivy_ObjIsBuf(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDfs.c"
                        ,0xe8,"Vec_Vec_t *Ivy_ManLevelize(Ivy_Man_t *)");
        }
        if (0xfffffffd < uVar7 - 7) {
          uVar7 = *(uint *)((long)pvVar1 + 8) >> 0xb;
          uVar8 = (uint)lVar9;
          if (uVar7 < uVar8) {
            if (uVar8 <= uVar7) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                            ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
            }
          }
          else {
            lVar10 = (ulong)uVar7 + 1;
            ppvVar4 = pVVar3->pArray;
            uVar11 = (uint)lVar10;
            if (local_4c <= uVar7) {
              if (ppvVar4 == (void **)0x0) {
                ppvVar4 = (void **)malloc((ulong)(uVar11 << 3));
              }
              else {
                ppvVar4 = (void **)realloc(ppvVar4,(ulong)(uVar11 << 3));
              }
              pVVar3->pArray = ppvVar4;
              pVVar3->nCap = uVar11;
              local_4c = uVar11;
            }
            lVar12 = 0;
            do {
              pvVar5 = calloc(1,0x10);
              ppvVar4[lVar9 + lVar12] = pvVar5;
              lVar12 = lVar12 + 1;
            } while ((uVar7 - uVar8) + 1 != (int)lVar12);
            pVVar3->nSize = uVar11;
          }
          puVar2 = (uint *)pVVar3->pArray[uVar7];
          uVar7 = puVar2[1];
          if (uVar7 == *puVar2) {
            if ((int)uVar7 < 0x10) {
              if (*(void **)(puVar2 + 2) == (void *)0x0) {
                pvVar5 = malloc(0x80);
              }
              else {
                pvVar5 = realloc(*(void **)(puVar2 + 2),0x80);
              }
              *(void **)(puVar2 + 2) = pvVar5;
              *puVar2 = 0x10;
            }
            else {
              if (*(void **)(puVar2 + 2) == (void *)0x0) {
                pvVar5 = malloc((ulong)uVar7 << 4);
              }
              else {
                pvVar5 = realloc(*(void **)(puVar2 + 2),(ulong)uVar7 << 4);
              }
              *(void **)(puVar2 + 2) = pvVar5;
              *puVar2 = uVar7 * 2;
            }
          }
          else {
            pvVar5 = *(void **)(puVar2 + 2);
          }
          uVar7 = puVar2[1];
          puVar2[1] = uVar7 + 1;
          *(void **)((long)pvVar5 + (long)(int)uVar7 * 8) = pvVar1;
          pVVar6 = p->vObjs;
        }
      }
      lVar13 = lVar13 + 1;
      lVar9 = lVar10;
    } while (lVar13 < pVVar6->nSize);
  }
  return pVVar3;
}

Assistant:

Vec_Vec_t * Ivy_ManLevelize( Ivy_Man_t * p )
{
    Vec_Vec_t * vNodes;
    Ivy_Obj_t * pObj;
    int i;
    vNodes = Vec_VecAlloc( 100 );
    Ivy_ManForEachObj( p, pObj, i )
    {
        assert( !Ivy_ObjIsBuf(pObj) );
        if ( Ivy_ObjIsNode(pObj) )
            Vec_VecPush( vNodes, pObj->Level, pObj );
    }
    return vNodes;
}